

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbor_encoder.hpp
# Opt level: O1

void __thiscall
jsoncons::cbor::
basic_cbor_encoder<jsoncons::bytes_sink<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::allocator<char>_>
::basic_cbor_encoder
          (basic_cbor_encoder<jsoncons::bytes_sink<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::allocator<char>_>
           *this,bytes_sink<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
                 *sink,cbor_encode_options *options,allocator<char> *alloc)

{
  _Rb_tree_header *p_Var1;
  _func_int *p_Var2;
  bool bVar3;
  
  (this->super_basic_json_visitor<char>)._vptr_basic_json_visitor =
       (_func_int **)&PTR__basic_cbor_encoder_00b5b678;
  (this->sink_).buf_ptr = sink->buf_ptr;
  p_Var2 = options->_vptr_cbor_encode_options[-3];
  *(undefined ***)&(this->options_).field_0x10 = &PTR__cbor_options_common_00b5b828;
  *(undefined4 *)&(this->options_).field_0x18 =
       *(undefined4 *)(&options->use_stringref_ + (long)p_Var2);
  (this->options_)._vptr_cbor_encode_options = (_func_int **)0xb5b7a8;
  *(undefined8 *)&(this->options_).field_0x10 = 0xb5b7d0;
  bVar3 = options->use_typed_arrays_;
  (this->options_).use_stringref_ = options->use_stringref_;
  (this->options_).use_typed_arrays_ = bVar3;
  (this->stack_).
  super__Vector_base<jsoncons::cbor::basic_cbor_encoder<jsoncons::bytes_sink<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::allocator<char>_>::stack_item,_std::allocator<jsoncons::cbor::basic_cbor_encoder<jsoncons::bytes_sink<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::allocator<char>_>::stack_item>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->stack_).
  super__Vector_base<jsoncons::cbor::basic_cbor_encoder<jsoncons::bytes_sink<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::allocator<char>_>::stack_item,_std::allocator<jsoncons::cbor::basic_cbor_encoder<jsoncons::bytes_sink<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::allocator<char>_>::stack_item>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->stack_).
  super__Vector_base<jsoncons::cbor::basic_cbor_encoder<jsoncons::bytes_sink<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::allocator<char>_>::stack_item,_std::allocator<jsoncons::cbor::basic_cbor_encoder<jsoncons::bytes_sink<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::allocator<char>_>::stack_item>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  p_Var1 = &(this->stringref_map_)._M_t._M_impl.super__Rb_tree_header;
  (this->stringref_map_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->stringref_map_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->stringref_map_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->stringref_map_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->stringref_map_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->bytestringref_map_)._M_t._M_impl.super__Rb_tree_header;
  (this->bytestringref_map_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->bytestringref_map_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0
  ;
  (this->bytestringref_map_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->bytestringref_map_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->bytestringref_map_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->next_stringref_ = 0;
  this->nesting_depth_ = 0;
  if (options->use_stringref_ == true) {
    write_tag(this,0x100);
  }
  return;
}

Assistant:

basic_cbor_encoder(Sink&& sink, 
                       const cbor_encode_options& options, 
                       const Allocator& alloc = Allocator())
       : sink_(std::forward<Sink>(sink)), 
         options_(options), 
         alloc_(alloc),
         stack_(alloc),
         stringref_map_(alloc),
         bytestringref_map_(alloc)
    {
        if (options.pack_strings())
        {
            write_tag(256);
        }
    }